

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_exception.cc
# Opt level: O0

void __thiscall VW::vw_exception::vw_exception(vw_exception *this,vw_exception *ex)

{
  long in_RSI;
  exception *in_RDI;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__vw_exception_0047ef18;
  *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(in_RSI + 8);
  std::__cxx11::string::string((string *)(in_RDI + 0x10),(string *)(in_RSI + 0x10));
  *(undefined4 *)(in_RDI + 0x30) = *(undefined4 *)(in_RSI + 0x30);
  return;
}

Assistant:

vw_exception::vw_exception(const vw_exception& ex) : file(ex.file), message(ex.message), lineNumber(ex.lineNumber) {}